

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void aom_paeth_predictor_64x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  uint8_t *puVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])above);
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar21._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar21._16_16_ = ZEXT116(1) * auVar3;
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x10));
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x10),(undefined1  [16])0x0);
  auVar22._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar22._16_16_ = ZEXT116(1) * auVar3;
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x20));
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x20),(undefined1  [16])0x0);
  auVar23._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar23._16_16_ = ZEXT116(1) * auVar3;
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x30));
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x30),(undefined1  [16])0x0);
  auVar24._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar24._16_16_ = ZEXT116(1) * auVar3;
  bVar1 = above[-1];
  auVar25[1] = 0;
  auVar25[0] = bVar1;
  auVar25[2] = bVar1;
  auVar25[3] = 0;
  auVar25[4] = bVar1;
  auVar25[5] = 0;
  auVar25[6] = bVar1;
  auVar25[7] = 0;
  auVar25[8] = bVar1;
  auVar25[9] = 0;
  auVar25[10] = bVar1;
  auVar25[0xb] = 0;
  auVar25[0xc] = bVar1;
  auVar25[0xd] = 0;
  auVar25[0xe] = bVar1;
  auVar25[0xf] = 0;
  auVar25[0x10] = bVar1;
  auVar25[0x11] = 0;
  auVar25[0x12] = bVar1;
  auVar25[0x13] = 0;
  auVar25[0x14] = bVar1;
  auVar25[0x15] = 0;
  auVar25[0x16] = bVar1;
  auVar25[0x17] = 0;
  auVar25[0x18] = bVar1;
  auVar25[0x19] = 0;
  auVar25[0x1a] = bVar1;
  auVar25[0x1b] = 0;
  auVar25[0x1c] = bVar1;
  auVar25[0x1d] = 0;
  auVar25[0x1e] = bVar1;
  auVar25[0x1f] = 0;
  uVar17 = *(undefined8 *)*(undefined1 (*) [16])(left + 0x10);
  uVar18 = *(undefined8 *)(left + 0x18);
  auVar2 = *(undefined1 (*) [16])(left + 0x10);
  auVar12 = vpsubw_avx2(auVar21,auVar25);
  auVar4 = vpabsw_avx2(auVar12);
  auVar13 = vpsubw_avx2(auVar22,auVar25);
  auVar5 = vpabsw_avx2(auVar13);
  auVar14 = vpsubw_avx2(auVar23,auVar25);
  auVar6 = vpabsw_avx2(auVar14);
  auVar15 = vpsubw_avx2(auVar24,auVar25);
  auVar7 = vpabsw_avx2(auVar15);
  puVar20 = dst + 0x30;
  auVar28._8_8_ = 0x8000800080008000;
  auVar28._0_8_ = 0x8000800080008000;
  auVar28._16_8_ = 0x8000800080008000;
  auVar28._24_8_ = 0x8000800080008000;
  iVar19 = 0x10;
  do {
    auVar16._16_8_ = uVar17;
    auVar16._0_16_ = auVar2;
    auVar16._24_8_ = uVar18;
    auVar11 = vpshufb_avx2(auVar16,auVar28);
    auVar8 = vpaddw_avx2(auVar11,auVar12);
    auVar16 = vpsubw_avx2(auVar8,auVar21);
    auVar16 = vpabsw_avx2(auVar16);
    auVar8 = vpsubw_avx2(auVar8,auVar25);
    auVar8 = vpabsw_avx2(auVar8);
    auVar26 = vpminsw_avx2(auVar16,auVar8);
    auVar26 = vpcmpgtw_avx2(auVar4,auVar26);
    auVar16 = vpcmpgtw_avx2(auVar16,auVar8);
    auVar8 = vpandn_avx2(auVar26,auVar11);
    auVar16 = vpblendvb_avx2(auVar21,auVar25,auVar16);
    auVar16 = vpand_avx2(auVar26,auVar16);
    auVar27 = vpor_avx2(auVar8,auVar16);
    auVar8 = vpaddw_avx2(auVar11,auVar13);
    auVar16 = vpsubw_avx2(auVar8,auVar22);
    auVar16 = vpabsw_avx2(auVar16);
    auVar8 = vpsubw_avx2(auVar8,auVar25);
    auVar8 = vpabsw_avx2(auVar8);
    auVar26 = vpminsw_avx2(auVar16,auVar8);
    auVar26 = vpcmpgtw_avx2(auVar5,auVar26);
    auVar16 = vpcmpgtw_avx2(auVar16,auVar8);
    auVar16 = vpblendvb_avx2(auVar22,auVar25,auVar16);
    auVar8 = vpandn_avx2(auVar26,auVar11);
    auVar16 = vpand_avx2(auVar26,auVar16);
    auVar9 = vpor_avx2(auVar8,auVar16);
    auVar8 = vpaddw_avx2(auVar14,auVar11);
    auVar16 = vpsubw_avx2(auVar8,auVar23);
    auVar16 = vpabsw_avx2(auVar16);
    auVar8 = vpsubw_avx2(auVar8,auVar25);
    auVar8 = vpabsw_avx2(auVar8);
    auVar26 = vpminsw_avx2(auVar16,auVar8);
    auVar26 = vpcmpgtw_avx2(auVar6,auVar26);
    auVar16 = vpcmpgtw_avx2(auVar16,auVar8);
    auVar8 = vpandn_avx2(auVar26,auVar11);
    auVar16 = vpblendvb_avx2(auVar23,auVar25,auVar16);
    auVar16 = vpand_avx2(auVar26,auVar16);
    auVar10 = vpor_avx2(auVar8,auVar16);
    auVar8 = vpaddw_avx2(auVar15,auVar11);
    auVar16 = vpsubw_avx2(auVar8,auVar24);
    auVar16 = vpabsw_avx2(auVar16);
    auVar8 = vpsubw_avx2(auVar8,auVar25);
    auVar8 = vpabsw_avx2(auVar8);
    auVar26 = vpminsw_avx2(auVar16,auVar8);
    auVar16 = vpcmpgtw_avx2(auVar16,auVar8);
    auVar26 = vpcmpgtw_avx2(auVar7,auVar26);
    auVar8 = vpandn_avx2(auVar26,auVar11);
    auVar16 = vpblendvb_avx2(auVar24,auVar25,auVar16);
    auVar16 = vpand_avx2(auVar26,auVar16);
    auVar8 = vpor_avx2(auVar8,auVar16);
    auVar16 = vperm2i128_avx2(auVar27,auVar9,0x31);
    auVar26._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar27._0_16_;
    auVar26._16_16_ = ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * auVar9._0_16_;
    auVar16 = vpackuswb_avx2(auVar26,auVar16);
    *(undefined1 (*) [32])(puVar20 + -0x30) = auVar16;
    auVar16 = vperm2i128_avx2(auVar10,auVar8,0x31);
    auVar27._0_16_ = ZEXT116(0) * auVar8._0_16_ + ZEXT116(1) * auVar10._0_16_;
    auVar27._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar8._0_16_;
    auVar16 = vpackuswb_avx2(auVar27,auVar16);
    *(undefined1 (*) [32])(puVar20 + -0x10) = auVar16;
    auVar28 = vpsubw_avx2(auVar28,_DAT_00510da0);
    puVar20 = puVar20 + stride;
    iVar19 = iVar19 + -1;
  } while (iVar19 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_64x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i t0 = get_top_vector(above);
  const __m256i t1 = get_top_vector(above + 16);
  const __m256i t2 = get_top_vector(above + 32);
  const __m256i t3 = get_top_vector(above + 48);
  const __m256i tl = _mm256_set1_epi16((int16_t)above[-1]);
  const __m256i one = _mm256_set1_epi16(1);

  int i;
  const __m256i l = get_left_vector(left);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);

    const __m128i r0 = paeth_16x1_pred(&l16, &t0, &tl);
    const __m128i r1 = paeth_16x1_pred(&l16, &t1, &tl);
    const __m128i r2 = paeth_16x1_pred(&l16, &t2, &tl);
    const __m128i r3 = paeth_16x1_pred(&l16, &t3, &tl);

    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r1);
    _mm_store_si128((__m128i *)(dst + 32), r2);
    _mm_store_si128((__m128i *)(dst + 48), r3);

    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}